

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_PackedParsing_Test::TestBody
          (ExtensionSetTest_PackedParsing_Test *this)

{
  pointer *__ptr;
  char *in_R9;
  string_view data_00;
  AssertionResult gtest_ar_;
  string data;
  TestPackedExtensions destination;
  TestPackedTypes source;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1d0;
  AssertHelper local_1c8;
  internal local_1c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  string local_1b0;
  string local_190;
  TestPackedExtensions local_170;
  TestPackedTypes local_140;
  
  proto2_unittest::TestPackedTypes::TestPackedTypes(&local_140,(Arena *)0x0);
  proto2_unittest::TestPackedExtensions::TestPackedExtensions(&local_170,(Arena *)0x0);
  local_1b0._M_string_length = 0;
  local_1b0.field_2._M_local_buf[0] = '\0';
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  TestUtil::SetPackedFields<proto2_unittest::TestPackedTypes>(&local_140);
  MessageLite::SerializeToString((MessageLite *)&local_140,&local_1b0);
  data_00._M_str = local_1b0._M_dataplus._M_p;
  data_00._M_len = local_1b0._M_string_length;
  local_1c0[0] = (internal)MessageLite::ParseFromString((MessageLite *)&local_170,data_00);
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_1c0[0]) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_190,local_1c0,(AssertionResult *)"destination.ParseFromString(data)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x297,local_190._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  if (local_1b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1b8,local_1b8);
  }
  TestUtil::ExpectPackedExtensionsSet<proto2_unittest::TestPackedExtensions>(&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,
                    CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                             local_1b0.field_2._M_local_buf[0]) + 1);
  }
  proto2_unittest::TestPackedExtensions::~TestPackedExtensions(&local_170);
  proto2_unittest::TestPackedTypes::~TestPackedTypes(&local_140);
  return;
}

Assistant:

TEST(ExtensionSetTest, PackedParsing) {
  // Serialize as TestPackedTypes and parse as TestPackedExtensions.
  unittest::TestPackedTypes source;
  unittest::TestPackedExtensions destination;
  std::string data;

  TestUtil::SetPackedFields(&source);
  source.SerializeToString(&data);
  EXPECT_TRUE(destination.ParseFromString(data));
  TestUtil::ExpectPackedExtensionsSet(destination);
}